

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O0

void iadst16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in1_07;
  __m256i in1_08;
  __m256i in1_09;
  __m256i in1_10;
  __m256i in1_11;
  __m256i in1_12;
  __m256i in1_13;
  __m256i in1_14;
  __m256i in1_15;
  __m256i in1_16;
  __m256i in1_17;
  __m256i in1_18;
  __m256i in1_19;
  __m256i in1_20;
  __m256i in1_21;
  __m256i in1_22;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i in0_07;
  __m256i in0_08;
  __m256i in0_09;
  __m256i in0_10;
  __m256i in0_11;
  __m256i in0_12;
  __m256i in0_13;
  __m256i in0_14;
  __m256i in0_15;
  __m256i in0_16;
  __m256i in0_17;
  __m256i in0_18;
  __m256i in0_19;
  __m256i in0_20;
  __m256i in0_21;
  __m256i in0_22;
  __m256i in1_23;
  __m256i in1_24;
  __m256i in1_25;
  __m256i in1_26;
  __m256i in1_27;
  __m256i in1_28;
  __m256i in1_29;
  __m256i in1_30;
  __m256i in0_23;
  __m256i in0_24;
  __m256i in0_25;
  __m256i in0_26;
  __m256i in0_27;
  __m256i in0_28;
  __m256i in0_29;
  __m256i in0_30;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  uint uVar122;
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  int32_t *piVar127;
  int in_ECX;
  uint uVar128;
  uint uVar129;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  __m256i clamp_hi_out;
  __m256i clamp_lo_out;
  int log_range_out;
  __m256i zero;
  __m256i y;
  __m256i x;
  __m256i u [16];
  __m256i clamp_hi;
  __m256i clamp_lo;
  int log_range;
  __m256i rnding;
  __m256i cospi32;
  __m256i cospim48;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospi24;
  __m256i cospi40;
  __m256i cospi56;
  __m256i cospi8;
  __m256i cospi6;
  __m256i cospi58;
  __m256i cospi14;
  __m256i cospi50;
  __m256i cospi22;
  __m256i cospi42;
  __m256i cospi30;
  __m256i cospi34;
  __m256i cospi38;
  __m256i cospi26;
  __m256i cospi46;
  __m256i cospi18;
  __m256i cospi54;
  __m256i cospi10;
  __m256i cospi62;
  __m256i cospi2;
  int32_t *cospi;
  char local_3c04;
  __m256i *local_3c00;
  __m256i *in_stack_ffffffffffffc420;
  int iVar133;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  uint uVar140;
  uint shift;
  uint uVar141;
  uint uVar142;
  uint uVar143;
  uint uVar144;
  uint uVar145;
  uint uVar146;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  uint uVar153;
  uint uVar154;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  char local_3844;
  char local_34b4;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_7a0;
  undefined8 uStack_798;
  longlong lStack_790;
  ulong uStack_118;
  ulong uStack_98;
  ulong uStack_78;
  ulong uStack_58;
  
  piVar127 = cospi_arr(in_EDX);
  uVar129 = piVar127[2];
  auVar1 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
  auVar1 = vpinsrd_avx(auVar1,uVar129,2);
  auVar1 = vpinsrd_avx(auVar1,uVar129,3);
  auVar131 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
  auVar131 = vpinsrd_avx(auVar131,uVar129,2);
  auVar131 = vpinsrd_avx(auVar131,uVar129,3);
  uStack_f10 = auVar131._0_8_;
  uStack_f08 = auVar131._8_8_;
  uVar134 = piVar127[0x3e];
  auVar131 = vpinsrd_avx(ZEXT416(uVar134),uVar134,1);
  auVar131 = vpinsrd_avx(auVar131,uVar134,2);
  auVar131 = vpinsrd_avx(auVar131,uVar134,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar134),uVar134,1);
  auVar2 = vpinsrd_avx(auVar2,uVar134,2);
  auVar2 = vpinsrd_avx(auVar2,uVar134,3);
  uStack_ed0 = auVar2._0_8_;
  uStack_ec8 = auVar2._8_8_;
  uVar135 = piVar127[10];
  auVar2 = vpinsrd_avx(ZEXT416(uVar135),uVar135,1);
  auVar2 = vpinsrd_avx(auVar2,uVar135,2);
  auVar2 = vpinsrd_avx(auVar2,uVar135,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar135),uVar135,1);
  auVar3 = vpinsrd_avx(auVar3,uVar135,2);
  auVar3 = vpinsrd_avx(auVar3,uVar135,3);
  uStack_e90 = auVar3._0_8_;
  uStack_e88 = auVar3._8_8_;
  uVar136 = piVar127[0x36];
  auVar3 = vpinsrd_avx(ZEXT416(uVar136),uVar136,1);
  auVar3 = vpinsrd_avx(auVar3,uVar136,2);
  auVar3 = vpinsrd_avx(auVar3,uVar136,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar136),uVar136,1);
  auVar4 = vpinsrd_avx(auVar4,uVar136,2);
  auVar4 = vpinsrd_avx(auVar4,uVar136,3);
  uStack_e50 = auVar4._0_8_;
  uStack_e48 = auVar4._8_8_;
  uVar137 = piVar127[0x12];
  auVar4 = vpinsrd_avx(ZEXT416(uVar137),uVar137,1);
  auVar4 = vpinsrd_avx(auVar4,uVar137,2);
  auVar4 = vpinsrd_avx(auVar4,uVar137,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar137),uVar137,1);
  auVar5 = vpinsrd_avx(auVar5,uVar137,2);
  auVar5 = vpinsrd_avx(auVar5,uVar137,3);
  uStack_e10 = auVar5._0_8_;
  uStack_e08 = auVar5._8_8_;
  uVar138 = piVar127[0x2e];
  auVar5 = vpinsrd_avx(ZEXT416(uVar138),uVar138,1);
  auVar5 = vpinsrd_avx(auVar5,uVar138,2);
  auVar5 = vpinsrd_avx(auVar5,uVar138,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar138),uVar138,1);
  auVar6 = vpinsrd_avx(auVar6,uVar138,2);
  auVar6 = vpinsrd_avx(auVar6,uVar138,3);
  uStack_dd0 = auVar6._0_8_;
  uStack_dc8 = auVar6._8_8_;
  uVar139 = piVar127[0x1a];
  auVar6 = vpinsrd_avx(ZEXT416(uVar139),uVar139,1);
  auVar6 = vpinsrd_avx(auVar6,uVar139,2);
  auVar6 = vpinsrd_avx(auVar6,uVar139,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar139),uVar139,1);
  auVar7 = vpinsrd_avx(auVar7,uVar139,2);
  auVar7 = vpinsrd_avx(auVar7,uVar139,3);
  uStack_d90 = auVar7._0_8_;
  uStack_d88 = auVar7._8_8_;
  uVar140 = piVar127[0x26];
  auVar7 = vpinsrd_avx(ZEXT416(uVar140),uVar140,1);
  auVar7 = vpinsrd_avx(auVar7,uVar140,2);
  auVar7 = vpinsrd_avx(auVar7,uVar140,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar140),uVar140,1);
  auVar8 = vpinsrd_avx(auVar8,uVar140,2);
  auVar8 = vpinsrd_avx(auVar8,uVar140,3);
  uStack_d50 = auVar8._0_8_;
  uStack_d48 = auVar8._8_8_;
  shift = piVar127[0x22];
  auVar8 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar8 = vpinsrd_avx(auVar8,shift,2);
  auVar8 = vpinsrd_avx(auVar8,shift,3);
  auVar9 = vpinsrd_avx(ZEXT416(shift),shift,1);
  auVar9 = vpinsrd_avx(auVar9,shift,2);
  auVar9 = vpinsrd_avx(auVar9,shift,3);
  uStack_d10 = auVar9._0_8_;
  uStack_d08 = auVar9._8_8_;
  uVar141 = piVar127[0x1e];
  auVar9 = vpinsrd_avx(ZEXT416(uVar141),uVar141,1);
  auVar9 = vpinsrd_avx(auVar9,uVar141,2);
  auVar9 = vpinsrd_avx(auVar9,uVar141,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar141),uVar141,1);
  auVar10 = vpinsrd_avx(auVar10,uVar141,2);
  auVar10 = vpinsrd_avx(auVar10,uVar141,3);
  uStack_cd0 = auVar10._0_8_;
  uStack_cc8 = auVar10._8_8_;
  uVar142 = piVar127[0x2a];
  auVar10 = vpinsrd_avx(ZEXT416(uVar142),uVar142,1);
  auVar10 = vpinsrd_avx(auVar10,uVar142,2);
  auVar10 = vpinsrd_avx(auVar10,uVar142,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar142),uVar142,1);
  auVar11 = vpinsrd_avx(auVar11,uVar142,2);
  auVar11 = vpinsrd_avx(auVar11,uVar142,3);
  uStack_c90 = auVar11._0_8_;
  uStack_c88 = auVar11._8_8_;
  uVar143 = piVar127[0x16];
  auVar11 = vpinsrd_avx(ZEXT416(uVar143),uVar143,1);
  auVar11 = vpinsrd_avx(auVar11,uVar143,2);
  auVar11 = vpinsrd_avx(auVar11,uVar143,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar143),uVar143,1);
  auVar12 = vpinsrd_avx(auVar12,uVar143,2);
  auVar12 = vpinsrd_avx(auVar12,uVar143,3);
  uStack_c50 = auVar12._0_8_;
  uStack_c48 = auVar12._8_8_;
  uVar144 = piVar127[0x32];
  auVar12 = vpinsrd_avx(ZEXT416(uVar144),uVar144,1);
  auVar12 = vpinsrd_avx(auVar12,uVar144,2);
  auVar12 = vpinsrd_avx(auVar12,uVar144,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar144),uVar144,1);
  auVar13 = vpinsrd_avx(auVar13,uVar144,2);
  auVar13 = vpinsrd_avx(auVar13,uVar144,3);
  uStack_c10 = auVar13._0_8_;
  uStack_c08 = auVar13._8_8_;
  uVar145 = piVar127[0xe];
  auVar13 = vpinsrd_avx(ZEXT416(uVar145),uVar145,1);
  auVar13 = vpinsrd_avx(auVar13,uVar145,2);
  auVar13 = vpinsrd_avx(auVar13,uVar145,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar145),uVar145,1);
  auVar14 = vpinsrd_avx(auVar14,uVar145,2);
  auVar14 = vpinsrd_avx(auVar14,uVar145,3);
  uStack_bd0 = auVar14._0_8_;
  uStack_bc8 = auVar14._8_8_;
  uVar146 = piVar127[0x3a];
  auVar14 = vpinsrd_avx(ZEXT416(uVar146),uVar146,1);
  auVar14 = vpinsrd_avx(auVar14,uVar146,2);
  auVar14 = vpinsrd_avx(auVar14,uVar146,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar146),uVar146,1);
  auVar15 = vpinsrd_avx(auVar15,uVar146,2);
  auVar15 = vpinsrd_avx(auVar15,uVar146,3);
  uStack_b90 = auVar15._0_8_;
  uStack_b88 = auVar15._8_8_;
  uVar147 = piVar127[6];
  auVar15 = vpinsrd_avx(ZEXT416(uVar147),uVar147,1);
  auVar15 = vpinsrd_avx(auVar15,uVar147,2);
  auVar15 = vpinsrd_avx(auVar15,uVar147,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar147),uVar147,1);
  auVar16 = vpinsrd_avx(auVar16,uVar147,2);
  auVar16 = vpinsrd_avx(auVar16,uVar147,3);
  uStack_b50 = auVar16._0_8_;
  uStack_b48 = auVar16._8_8_;
  uVar148 = piVar127[8];
  auVar16 = vpinsrd_avx(ZEXT416(uVar148),uVar148,1);
  auVar16 = vpinsrd_avx(auVar16,uVar148,2);
  auVar16 = vpinsrd_avx(auVar16,uVar148,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar148),uVar148,1);
  auVar17 = vpinsrd_avx(auVar17,uVar148,2);
  auVar17 = vpinsrd_avx(auVar17,uVar148,3);
  uStack_b10 = auVar17._0_8_;
  uStack_b08 = auVar17._8_8_;
  uVar149 = piVar127[0x38];
  auVar17 = vpinsrd_avx(ZEXT416(uVar149),uVar149,1);
  auVar17 = vpinsrd_avx(auVar17,uVar149,2);
  auVar17 = vpinsrd_avx(auVar17,uVar149,3);
  auVar18 = vpinsrd_avx(ZEXT416(uVar149),uVar149,1);
  auVar18 = vpinsrd_avx(auVar18,uVar149,2);
  auVar18 = vpinsrd_avx(auVar18,uVar149,3);
  uStack_ad0 = auVar18._0_8_;
  uStack_ac8 = auVar18._8_8_;
  uVar150 = piVar127[0x28];
  auVar18 = vpinsrd_avx(ZEXT416(uVar150),uVar150,1);
  auVar18 = vpinsrd_avx(auVar18,uVar150,2);
  auVar18 = vpinsrd_avx(auVar18,uVar150,3);
  auVar19 = vpinsrd_avx(ZEXT416(uVar150),uVar150,1);
  auVar19 = vpinsrd_avx(auVar19,uVar150,2);
  auVar19 = vpinsrd_avx(auVar19,uVar150,3);
  uStack_a90 = auVar19._0_8_;
  uStack_a88 = auVar19._8_8_;
  uVar151 = piVar127[0x18];
  auVar19 = vpinsrd_avx(ZEXT416(uVar151),uVar151,1);
  auVar19 = vpinsrd_avx(auVar19,uVar151,2);
  auVar19 = vpinsrd_avx(auVar19,uVar151,3);
  auVar20 = vpinsrd_avx(ZEXT416(uVar151),uVar151,1);
  auVar20 = vpinsrd_avx(auVar20,uVar151,2);
  auVar20 = vpinsrd_avx(auVar20,uVar151,3);
  uStack_a50 = auVar20._0_8_;
  uStack_a48 = auVar20._8_8_;
  uVar122 = -piVar127[0x38];
  auVar20 = vpinsrd_avx(ZEXT416(uVar122),uVar122,1);
  auVar20 = vpinsrd_avx(auVar20,uVar122,2);
  auVar20 = vpinsrd_avx(auVar20,uVar122,3);
  auVar21 = vpinsrd_avx(ZEXT416(uVar122),uVar122,1);
  auVar21 = vpinsrd_avx(auVar21,uVar122,2);
  auVar21 = vpinsrd_avx(auVar21,uVar122,3);
  uStack_a10 = auVar21._0_8_;
  uStack_a08 = auVar21._8_8_;
  uVar123 = -piVar127[0x18];
  auVar21 = vpinsrd_avx(ZEXT416(uVar123),uVar123,1);
  auVar21 = vpinsrd_avx(auVar21,uVar123,2);
  auVar21 = vpinsrd_avx(auVar21,uVar123,3);
  auVar22 = vpinsrd_avx(ZEXT416(uVar123),uVar123,1);
  auVar22 = vpinsrd_avx(auVar22,uVar123,2);
  auVar22 = vpinsrd_avx(auVar22,uVar123,3);
  uStack_9d0 = auVar22._0_8_;
  uStack_9c8 = auVar22._8_8_;
  uVar152 = piVar127[0x30];
  auVar22 = vpinsrd_avx(ZEXT416(uVar152),uVar152,1);
  auVar22 = vpinsrd_avx(auVar22,uVar152,2);
  auVar22 = vpinsrd_avx(auVar22,uVar152,3);
  auVar23 = vpinsrd_avx(ZEXT416(uVar152),uVar152,1);
  auVar23 = vpinsrd_avx(auVar23,uVar152,2);
  auVar23 = vpinsrd_avx(auVar23,uVar152,3);
  uStack_990 = auVar23._0_8_;
  uStack_988 = auVar23._8_8_;
  uVar153 = piVar127[0x10];
  auVar23 = vpinsrd_avx(ZEXT416(uVar153),uVar153,1);
  auVar23 = vpinsrd_avx(auVar23,uVar153,2);
  auVar23 = vpinsrd_avx(auVar23,uVar153,3);
  auVar24 = vpinsrd_avx(ZEXT416(uVar153),uVar153,1);
  auVar24 = vpinsrd_avx(auVar24,uVar153,2);
  auVar24 = vpinsrd_avx(auVar24,uVar153,3);
  uStack_950 = auVar24._0_8_;
  uStack_948 = auVar24._8_8_;
  uVar124 = -piVar127[0x30];
  auVar24 = vpinsrd_avx(ZEXT416(uVar124),uVar124,1);
  auVar24 = vpinsrd_avx(auVar24,uVar124,2);
  auVar24 = vpinsrd_avx(auVar24,uVar124,3);
  auVar25 = vpinsrd_avx(ZEXT416(uVar124),uVar124,1);
  auVar25 = vpinsrd_avx(auVar25,uVar124,2);
  auVar25 = vpinsrd_avx(auVar25,uVar124,3);
  uStack_910 = auVar25._0_8_;
  uStack_908 = auVar25._8_8_;
  uVar154 = piVar127[0x20];
  auVar25 = vpinsrd_avx(ZEXT416(uVar154),uVar154,1);
  auVar25 = vpinsrd_avx(auVar25,uVar154,2);
  auVar25 = vpinsrd_avx(auVar25,uVar154,3);
  auVar132 = vpinsrd_avx(ZEXT416(uVar154),uVar154,1);
  auVar132 = vpinsrd_avx(auVar132,uVar154,2);
  auVar132 = vpinsrd_avx(auVar132,uVar154,3);
  uStack_8d0 = auVar132._0_8_;
  uStack_8c8 = auVar132._8_8_;
  local_34b4 = (char)in_EDX;
  uVar125 = 1 << (local_34b4 - 1U & 0x1f);
  auVar132 = vpinsrd_avx(ZEXT416(uVar125),uVar125,1);
  auVar132 = vpinsrd_avx(auVar132,uVar125,2);
  auVar132 = vpinsrd_avx(auVar132,uVar125,3);
  auVar130 = vpinsrd_avx(ZEXT416(uVar125),uVar125,1);
  auVar130 = vpinsrd_avx(auVar130,uVar125,2);
  auVar130 = vpinsrd_avx(auVar130,uVar125,3);
  auVar130 = ZEXT116(0) * auVar132 + ZEXT116(1) * auVar130;
  auVar132 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar132;
  uStack_890 = auVar132._0_8_;
  uStack_888 = auVar132._8_8_;
  iVar133 = 8;
  if (in_ECX != 0) {
    iVar133 = 6;
  }
  if (in_R8D + iVar133 < 0x10) {
    iVar133 = 0x10;
  }
  else {
    iVar133 = 8;
    if (in_ECX != 0) {
      iVar133 = 6;
    }
    iVar133 = in_R8D + iVar133;
  }
  local_3844 = (char)iVar133;
  uVar128 = -(1 << (local_3844 - 1U & 0x1f));
  auVar132 = vpinsrd_avx(ZEXT416(uVar128),uVar128,1);
  auVar132 = vpinsrd_avx(auVar132,uVar128,2);
  vpinsrd_avx(auVar132,uVar128,3);
  auVar132 = vpinsrd_avx(ZEXT416(uVar128),uVar128,1);
  auVar132 = vpinsrd_avx(auVar132,uVar128,2);
  vpinsrd_avx(auVar132,uVar128,3);
  uVar126 = (1 << (local_3844 - 1U & 0x1f)) - 1;
  auVar132 = vpinsrd_avx(ZEXT416(uVar126),uVar126,1);
  auVar132 = vpinsrd_avx(auVar132,uVar126,2);
  vpinsrd_avx(auVar132,uVar126,3);
  auVar132 = vpinsrd_avx(ZEXT416(uVar126),uVar126,1);
  auVar132 = vpinsrd_avx(auVar132,uVar126,2);
  vpinsrd_avx(auVar132,uVar126,3);
  uStack_58 = SUB328(ZEXT832(0),4);
  auVar28._16_8_ = uStack_ed0;
  auVar28._0_16_ = auVar131;
  auVar28._24_8_ = uStack_ec8;
  auVar26 = vpmulld_avx2(*in_RDI,auVar28);
  auVar121._16_8_ = uStack_890;
  auVar121._0_16_ = auVar130;
  auVar121._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar121);
  auVar28 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar29._16_8_ = uStack_f10;
  auVar29._0_16_ = auVar1;
  auVar29._24_8_ = uStack_f08;
  auVar26 = vpmulld_avx2(*in_RDI,auVar29);
  auVar26 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar26);
  auVar120._16_8_ = uStack_890;
  auVar120._0_16_ = auVar130;
  auVar120._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar120);
  auVar29 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar81._16_8_ = uStack_e50;
  auVar81._0_16_ = auVar3;
  auVar81._24_8_ = uStack_e48;
  auVar26 = vpmulld_avx2(in_RDI[2],auVar81);
  auVar119._16_8_ = uStack_890;
  auVar119._0_16_ = auVar130;
  auVar119._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar119);
  auVar30 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar31._16_8_ = uStack_e90;
  auVar31._0_16_ = auVar2;
  auVar31._24_8_ = uStack_e88;
  auVar26 = vpmulld_avx2(in_RDI[2],auVar31);
  auVar26 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar26);
  auVar118._16_8_ = uStack_890;
  auVar118._0_16_ = auVar130;
  auVar118._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar118);
  auVar31 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar32._16_8_ = uStack_dd0;
  auVar32._0_16_ = auVar5;
  auVar32._24_8_ = uStack_dc8;
  auVar26 = vpmulld_avx2(in_RDI[4],auVar32);
  auVar117._16_8_ = uStack_890;
  auVar117._0_16_ = auVar130;
  auVar117._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar117);
  auVar32 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar33._16_8_ = uStack_e10;
  auVar33._0_16_ = auVar4;
  auVar33._24_8_ = uStack_e08;
  auVar26 = vpmulld_avx2(in_RDI[4],auVar33);
  auVar26 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar26);
  auVar116._16_8_ = uStack_890;
  auVar116._0_16_ = auVar130;
  auVar116._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar116);
  auVar33 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar80._16_8_ = uStack_d50;
  auVar80._0_16_ = auVar7;
  auVar80._24_8_ = uStack_d48;
  auVar26 = vpmulld_avx2(in_RDI[6],auVar80);
  auVar115._16_8_ = uStack_890;
  auVar115._0_16_ = auVar130;
  auVar115._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar115);
  auVar34 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar35._16_8_ = uStack_d90;
  auVar35._0_16_ = auVar6;
  auVar35._24_8_ = uStack_d88;
  auVar26 = vpmulld_avx2(in_RDI[6],auVar35);
  auVar26 = vpsubd_avx2(ZEXT832(uStack_58) << 0x40,auVar26);
  auVar114._16_8_ = uStack_890;
  auVar114._0_16_ = auVar130;
  auVar114._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar114);
  auVar35 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar79._16_8_ = uStack_d10;
  auVar79._0_16_ = auVar8;
  auVar79._24_8_ = uStack_d08;
  auVar26 = vpmulld_avx2(in_RDI[7],auVar79);
  auVar113._16_8_ = uStack_890;
  auVar113._0_16_ = auVar130;
  auVar113._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar113);
  auVar36 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar37._16_8_ = uStack_cd0;
  auVar37._0_16_ = auVar9;
  auVar37._24_8_ = uStack_cc8;
  auVar26 = vpmulld_avx2(in_RDI[7],auVar37);
  auVar112._16_8_ = uStack_890;
  auVar112._0_16_ = auVar130;
  auVar112._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar112);
  auVar37 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar38._16_8_ = uStack_c90;
  auVar38._0_16_ = auVar10;
  auVar38._24_8_ = uStack_c88;
  auVar26 = vpmulld_avx2(in_RDI[5],auVar38);
  auVar111._16_8_ = uStack_890;
  auVar111._0_16_ = auVar130;
  auVar111._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar111);
  auVar38 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar39._16_8_ = uStack_c50;
  auVar39._0_16_ = auVar11;
  auVar39._24_8_ = uStack_c48;
  auVar26 = vpmulld_avx2(in_RDI[5],auVar39);
  auVar110._16_8_ = uStack_890;
  auVar110._0_16_ = auVar130;
  auVar110._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar110);
  auVar39 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar40._16_8_ = uStack_c10;
  auVar40._0_16_ = auVar12;
  auVar40._24_8_ = uStack_c08;
  auVar26 = vpmulld_avx2(in_RDI[3],auVar40);
  auVar109._16_8_ = uStack_890;
  auVar109._0_16_ = auVar130;
  auVar109._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar109);
  auVar40 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar41._16_8_ = uStack_bd0;
  auVar41._0_16_ = auVar13;
  auVar41._24_8_ = uStack_bc8;
  auVar26 = vpmulld_avx2(in_RDI[3],auVar41);
  auVar108._16_8_ = uStack_890;
  auVar108._0_16_ = auVar130;
  auVar108._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar108);
  auVar41 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar42._16_8_ = uStack_b90;
  auVar42._0_16_ = auVar14;
  auVar42._24_8_ = uStack_b88;
  auVar26 = vpmulld_avx2(in_RDI[1],auVar42);
  auVar107._16_8_ = uStack_890;
  auVar107._0_16_ = auVar130;
  auVar107._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar107);
  auVar42 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar43._16_8_ = uStack_b50;
  auVar43._0_16_ = auVar15;
  auVar43._24_8_ = uStack_b48;
  auVar26 = vpmulld_avx2(in_RDI[1],auVar43);
  auVar106._16_8_ = uStack_890;
  auVar106._0_16_ = auVar130;
  auVar106._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar106);
  auVar43 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0[0]._4_4_ = uVar142;
  in0[0]._0_4_ = uVar141;
  in0[1]._0_4_ = uVar143;
  in0[1]._4_4_ = uVar144;
  in0[2]._0_4_ = uVar145;
  in0[2]._4_4_ = uVar146;
  in0[3]._0_4_ = uVar147;
  in0[3]._4_4_ = uVar148;
  in1[0]._4_4_ = uVar135;
  in1[0]._0_4_ = uVar134;
  in1[1]._0_4_ = uVar136;
  in1[1]._4_4_ = uVar137;
  in1[2]._0_4_ = uVar138;
  in1[2]._4_4_ = uVar139;
  in1[3]._0_4_ = uVar140;
  in1[3]._4_4_ = shift;
  addsub_avx2(in0,in1,(__m256i *)CONCAT44(uVar129,iVar133),(__m256i *)CONCAT44(uVar126,uVar128),
              in_stack_ffffffffffffc420,local_3c00);
  in0_00[0]._4_4_ = uVar142;
  in0_00[0]._0_4_ = uVar141;
  in0_00[1]._0_4_ = uVar143;
  in0_00[1]._4_4_ = uVar144;
  in0_00[2]._0_4_ = uVar145;
  in0_00[2]._4_4_ = uVar146;
  in0_00[3]._0_4_ = uVar147;
  in0_00[3]._4_4_ = uVar148;
  in1_00[0]._4_4_ = uVar135;
  in1_00[0]._0_4_ = uVar134;
  in1_00[1]._0_4_ = uVar136;
  in1_00[1]._4_4_ = uVar137;
  in1_00[2]._0_4_ = uVar138;
  in1_00[2]._4_4_ = uVar139;
  in1_00[3]._0_4_ = uVar140;
  in1_00[3]._4_4_ = shift;
  addsub_avx2(in0_00,in1_00,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_01[0]._4_4_ = uVar142;
  in0_01[0]._0_4_ = uVar141;
  in0_01[1]._0_4_ = uVar143;
  in0_01[1]._4_4_ = uVar144;
  in0_01[2]._0_4_ = uVar145;
  in0_01[2]._4_4_ = uVar146;
  in0_01[3]._0_4_ = uVar147;
  in0_01[3]._4_4_ = uVar148;
  in1_01[0]._4_4_ = uVar135;
  in1_01[0]._0_4_ = uVar134;
  in1_01[1]._0_4_ = uVar136;
  in1_01[1]._4_4_ = uVar137;
  in1_01[2]._0_4_ = uVar138;
  in1_01[2]._4_4_ = uVar139;
  in1_01[3]._0_4_ = uVar140;
  in1_01[3]._4_4_ = shift;
  addsub_avx2(in0_01,in1_01,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_02[0]._4_4_ = uVar142;
  in0_02[0]._0_4_ = uVar141;
  in0_02[1]._0_4_ = uVar143;
  in0_02[1]._4_4_ = uVar144;
  in0_02[2]._0_4_ = uVar145;
  in0_02[2]._4_4_ = uVar146;
  in0_02[3]._0_4_ = uVar147;
  in0_02[3]._4_4_ = uVar148;
  in1_02[0]._4_4_ = uVar135;
  in1_02[0]._0_4_ = uVar134;
  in1_02[1]._0_4_ = uVar136;
  in1_02[1]._4_4_ = uVar137;
  in1_02[2]._0_4_ = uVar138;
  in1_02[2]._4_4_ = uVar139;
  in1_02[3]._0_4_ = uVar140;
  in1_02[3]._4_4_ = shift;
  addsub_avx2(in0_02,in1_02,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_03[0]._4_4_ = uVar142;
  in0_03[0]._0_4_ = uVar141;
  in0_03[1]._0_4_ = uVar143;
  in0_03[1]._4_4_ = uVar144;
  in0_03[2]._0_4_ = uVar145;
  in0_03[2]._4_4_ = uVar146;
  in0_03[3]._0_4_ = uVar147;
  in0_03[3]._4_4_ = uVar148;
  in1_03[0]._4_4_ = uVar135;
  in1_03[0]._0_4_ = uVar134;
  in1_03[1]._0_4_ = uVar136;
  in1_03[1]._4_4_ = uVar137;
  in1_03[2]._0_4_ = uVar138;
  in1_03[2]._4_4_ = uVar139;
  in1_03[3]._0_4_ = uVar140;
  in1_03[3]._4_4_ = shift;
  addsub_avx2(in0_03,in1_03,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_04[0]._4_4_ = uVar142;
  in0_04[0]._0_4_ = uVar141;
  in0_04[1]._0_4_ = uVar143;
  in0_04[1]._4_4_ = uVar144;
  in0_04[2]._0_4_ = uVar145;
  in0_04[2]._4_4_ = uVar146;
  in0_04[3]._0_4_ = uVar147;
  in0_04[3]._4_4_ = uVar148;
  in1_04[0]._4_4_ = uVar135;
  in1_04[0]._0_4_ = uVar134;
  in1_04[1]._0_4_ = uVar136;
  in1_04[1]._4_4_ = uVar137;
  in1_04[2]._0_4_ = uVar138;
  in1_04[2]._4_4_ = uVar139;
  in1_04[3]._0_4_ = uVar140;
  in1_04[3]._4_4_ = shift;
  addsub_avx2(in0_04,in1_04,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_05[0]._4_4_ = uVar142;
  in0_05[0]._0_4_ = uVar141;
  in0_05[1]._0_4_ = uVar143;
  in0_05[1]._4_4_ = uVar144;
  in0_05[2]._0_4_ = uVar145;
  in0_05[2]._4_4_ = uVar146;
  in0_05[3]._0_4_ = uVar147;
  in0_05[3]._4_4_ = uVar148;
  in1_05[0]._4_4_ = uVar135;
  in1_05[0]._0_4_ = uVar134;
  in1_05[1]._0_4_ = uVar136;
  in1_05[1]._4_4_ = uVar137;
  in1_05[2]._0_4_ = uVar138;
  in1_05[2]._4_4_ = uVar139;
  in1_05[3]._0_4_ = uVar140;
  in1_05[3]._4_4_ = shift;
  addsub_avx2(in0_05,in1_05,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_06[0]._4_4_ = uVar142;
  in0_06[0]._0_4_ = uVar141;
  in0_06[1]._0_4_ = uVar143;
  in0_06[1]._4_4_ = uVar144;
  in0_06[2]._0_4_ = uVar145;
  in0_06[2]._4_4_ = uVar146;
  in0_06[3]._0_4_ = uVar147;
  in0_06[3]._4_4_ = uVar148;
  in1_06[0]._4_4_ = uVar135;
  in1_06[0]._0_4_ = uVar134;
  in1_06[1]._0_4_ = uVar136;
  in1_06[1]._4_4_ = uVar137;
  in1_06[2]._0_4_ = uVar138;
  in1_06[2]._4_4_ = uVar139;
  in1_06[3]._0_4_ = uVar140;
  in1_06[3]._4_4_ = shift;
  addsub_avx2(in0_06,in1_06,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  auVar78._16_8_ = uStack_ad0;
  auVar78._0_16_ = auVar17;
  auVar78._24_8_ = uStack_ac8;
  auVar27 = vpmulld_avx2(auVar36,auVar78);
  auVar77._16_8_ = uStack_ad0;
  auVar77._0_16_ = auVar17;
  auVar77._24_8_ = uStack_ac8;
  auVar26 = vpmulld_avx2(auVar37,auVar77);
  auVar44._16_8_ = uStack_b10;
  auVar44._0_16_ = auVar16;
  auVar44._24_8_ = uStack_b08;
  auVar36 = vpmulld_avx2(auVar36,auVar44);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar105._16_8_ = uStack_890;
  auVar105._0_16_ = auVar130;
  auVar105._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar105);
  auVar44 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar76._16_8_ = uStack_b10;
  auVar76._0_16_ = auVar16;
  auVar76._24_8_ = uStack_b08;
  auVar26 = vpmulld_avx2(auVar37,auVar76);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar104._16_8_ = uStack_890;
  auVar104._0_16_ = auVar130;
  auVar104._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar104);
  auVar37 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar75._16_8_ = uStack_a50;
  auVar75._0_16_ = auVar19;
  auVar75._24_8_ = uStack_a48;
  auVar26 = vpmulld_avx2(auVar39,auVar75);
  auVar74._16_8_ = uStack_a50;
  auVar74._0_16_ = auVar19;
  auVar74._24_8_ = uStack_a48;
  auVar27 = vpmulld_avx2(auVar38,auVar74);
  auVar73._16_8_ = uStack_a90;
  auVar73._0_16_ = auVar18;
  auVar73._24_8_ = uStack_a88;
  auVar36 = vpmulld_avx2(auVar38,auVar73);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar103._16_8_ = uStack_890;
  auVar103._0_16_ = auVar130;
  auVar103._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar103);
  auVar38 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar72._16_8_ = uStack_a90;
  auVar72._0_16_ = auVar18;
  auVar72._24_8_ = uStack_a88;
  auVar26 = vpmulld_avx2(auVar39,auVar72);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar102._16_8_ = uStack_890;
  auVar102._0_16_ = auVar130;
  auVar102._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar102);
  auVar39 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar71._16_8_ = uStack_b10;
  auVar71._0_16_ = auVar16;
  auVar71._24_8_ = uStack_b08;
  auVar26 = vpmulld_avx2(auVar41,auVar71);
  auVar70._16_8_ = uStack_b10;
  auVar70._0_16_ = auVar16;
  auVar70._24_8_ = uStack_b08;
  auVar27 = vpmulld_avx2(auVar40,auVar70);
  auVar69._16_8_ = uStack_a10;
  auVar69._0_16_ = auVar20;
  auVar69._24_8_ = uStack_a08;
  auVar36 = vpmulld_avx2(auVar40,auVar69);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar101._16_8_ = uStack_890;
  auVar101._0_16_ = auVar130;
  auVar101._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar101);
  auVar40 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar68._16_8_ = uStack_a10;
  auVar68._0_16_ = auVar20;
  auVar68._24_8_ = uStack_a08;
  auVar26 = vpmulld_avx2(auVar41,auVar68);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar100._16_8_ = uStack_890;
  auVar100._0_16_ = auVar130;
  auVar100._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar100);
  auVar41 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar67._16_8_ = uStack_a90;
  auVar67._0_16_ = auVar18;
  auVar67._24_8_ = uStack_a88;
  auVar26 = vpmulld_avx2(auVar43,auVar67);
  auVar66._16_8_ = uStack_a90;
  auVar66._0_16_ = auVar18;
  auVar66._24_8_ = uStack_a88;
  auVar27 = vpmulld_avx2(auVar42,auVar66);
  auVar65._16_8_ = uStack_9d0;
  auVar65._0_16_ = auVar21;
  auVar65._24_8_ = uStack_9c8;
  auVar36 = vpmulld_avx2(auVar42,auVar65);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar99._16_8_ = uStack_890;
  auVar99._0_16_ = auVar130;
  auVar99._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar99);
  auVar42 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar64._16_8_ = uStack_9d0;
  auVar64._0_16_ = auVar21;
  auVar64._24_8_ = uStack_9c8;
  auVar26 = vpmulld_avx2(auVar43,auVar64);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar98._16_8_ = uStack_890;
  auVar98._0_16_ = auVar130;
  auVar98._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar98);
  auVar43 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0_07[0]._4_4_ = uVar142;
  in0_07[0]._0_4_ = uVar141;
  in0_07[1]._0_4_ = uVar143;
  in0_07[1]._4_4_ = uVar144;
  in0_07[2]._0_4_ = uVar145;
  in0_07[2]._4_4_ = uVar146;
  in0_07[3]._0_4_ = uVar147;
  in0_07[3]._4_4_ = uVar148;
  in1_07[0]._4_4_ = uVar135;
  in1_07[0]._0_4_ = uVar134;
  in1_07[1]._0_4_ = uVar136;
  in1_07[1]._4_4_ = uVar137;
  in1_07[2]._0_4_ = uVar138;
  in1_07[2]._4_4_ = uVar139;
  in1_07[3]._0_4_ = uVar140;
  in1_07[3]._4_4_ = shift;
  addsub_avx2(in0_07,in1_07,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_08[0]._4_4_ = uVar142;
  in0_08[0]._0_4_ = uVar141;
  in0_08[1]._0_4_ = uVar143;
  in0_08[1]._4_4_ = uVar144;
  in0_08[2]._0_4_ = uVar145;
  in0_08[2]._4_4_ = uVar146;
  in0_08[3]._0_4_ = uVar147;
  in0_08[3]._4_4_ = uVar148;
  in1_08[0]._4_4_ = uVar135;
  in1_08[0]._0_4_ = uVar134;
  in1_08[1]._0_4_ = uVar136;
  in1_08[1]._4_4_ = uVar137;
  in1_08[2]._0_4_ = uVar138;
  in1_08[2]._4_4_ = uVar139;
  in1_08[3]._0_4_ = uVar140;
  in1_08[3]._4_4_ = shift;
  addsub_avx2(in0_08,in1_08,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_09[0]._4_4_ = uVar142;
  in0_09[0]._0_4_ = uVar141;
  in0_09[1]._0_4_ = uVar143;
  in0_09[1]._4_4_ = uVar144;
  in0_09[2]._0_4_ = uVar145;
  in0_09[2]._4_4_ = uVar146;
  in0_09[3]._0_4_ = uVar147;
  in0_09[3]._4_4_ = uVar148;
  in1_09[0]._4_4_ = uVar135;
  in1_09[0]._0_4_ = uVar134;
  in1_09[1]._0_4_ = uVar136;
  in1_09[1]._4_4_ = uVar137;
  in1_09[2]._0_4_ = uVar138;
  in1_09[2]._4_4_ = uVar139;
  in1_09[3]._0_4_ = uVar140;
  in1_09[3]._4_4_ = shift;
  addsub_avx2(in0_09,in1_09,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_10[0]._4_4_ = uVar142;
  in0_10[0]._0_4_ = uVar141;
  in0_10[1]._0_4_ = uVar143;
  in0_10[1]._4_4_ = uVar144;
  in0_10[2]._0_4_ = uVar145;
  in0_10[2]._4_4_ = uVar146;
  in0_10[3]._0_4_ = uVar147;
  in0_10[3]._4_4_ = uVar148;
  in1_10[0]._4_4_ = uVar135;
  in1_10[0]._0_4_ = uVar134;
  in1_10[1]._0_4_ = uVar136;
  in1_10[1]._4_4_ = uVar137;
  in1_10[2]._0_4_ = uVar138;
  in1_10[2]._4_4_ = uVar139;
  in1_10[3]._0_4_ = uVar140;
  in1_10[3]._4_4_ = shift;
  addsub_avx2(in0_10,in1_10,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_11[0]._4_4_ = uVar142;
  in0_11[0]._0_4_ = uVar141;
  in0_11[1]._0_4_ = uVar143;
  in0_11[1]._4_4_ = uVar144;
  in0_11[2]._0_4_ = uVar145;
  in0_11[2]._4_4_ = uVar146;
  in0_11[3]._0_4_ = uVar147;
  in0_11[3]._4_4_ = uVar148;
  in1_11[0]._4_4_ = uVar135;
  in1_11[0]._0_4_ = uVar134;
  in1_11[1]._0_4_ = uVar136;
  in1_11[1]._4_4_ = uVar137;
  in1_11[2]._0_4_ = uVar138;
  in1_11[2]._4_4_ = uVar139;
  in1_11[3]._0_4_ = uVar140;
  in1_11[3]._4_4_ = shift;
  addsub_avx2(in0_11,in1_11,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_12[0]._4_4_ = uVar142;
  in0_12[0]._0_4_ = uVar141;
  in0_12[1]._0_4_ = uVar143;
  in0_12[1]._4_4_ = uVar144;
  in0_12[2]._0_4_ = uVar145;
  in0_12[2]._4_4_ = uVar146;
  in0_12[3]._0_4_ = uVar147;
  in0_12[3]._4_4_ = uVar148;
  in1_12[0]._4_4_ = uVar135;
  in1_12[0]._0_4_ = uVar134;
  in1_12[1]._0_4_ = uVar136;
  in1_12[1]._4_4_ = uVar137;
  in1_12[2]._0_4_ = uVar138;
  in1_12[2]._4_4_ = uVar139;
  in1_12[3]._0_4_ = uVar140;
  in1_12[3]._4_4_ = shift;
  addsub_avx2(in0_12,in1_12,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_13[0]._4_4_ = uVar142;
  in0_13[0]._0_4_ = uVar141;
  in0_13[1]._0_4_ = uVar143;
  in0_13[1]._4_4_ = uVar144;
  in0_13[2]._0_4_ = uVar145;
  in0_13[2]._4_4_ = uVar146;
  in0_13[3]._0_4_ = uVar147;
  in0_13[3]._4_4_ = uVar148;
  in1_13[0]._4_4_ = uVar135;
  in1_13[0]._0_4_ = uVar134;
  in1_13[1]._0_4_ = uVar136;
  in1_13[1]._4_4_ = uVar137;
  in1_13[2]._0_4_ = uVar138;
  in1_13[2]._4_4_ = uVar139;
  in1_13[3]._0_4_ = uVar140;
  in1_13[3]._4_4_ = shift;
  addsub_avx2(in0_13,in1_13,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_14[0]._4_4_ = uVar142;
  in0_14[0]._0_4_ = uVar141;
  in0_14[1]._0_4_ = uVar143;
  in0_14[1]._4_4_ = uVar144;
  in0_14[2]._0_4_ = uVar145;
  in0_14[2]._4_4_ = uVar146;
  in0_14[3]._0_4_ = uVar147;
  in0_14[3]._4_4_ = uVar148;
  in1_14[0]._4_4_ = uVar135;
  in1_14[0]._0_4_ = uVar134;
  in1_14[1]._0_4_ = uVar136;
  in1_14[1]._4_4_ = uVar137;
  in1_14[2]._0_4_ = uVar138;
  in1_14[2]._4_4_ = uVar139;
  in1_14[3]._0_4_ = uVar140;
  in1_14[3]._4_4_ = shift;
  addsub_avx2(in0_14,in1_14,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  auVar63._16_8_ = uStack_990;
  auVar63._0_16_ = auVar22;
  auVar63._24_8_ = uStack_988;
  auVar26 = vpmulld_avx2(auVar33,auVar63);
  auVar62._16_8_ = uStack_990;
  auVar62._0_16_ = auVar22;
  auVar62._24_8_ = uStack_988;
  auVar27 = vpmulld_avx2(auVar32,auVar62);
  auVar61._16_8_ = uStack_950;
  auVar61._0_16_ = auVar23;
  auVar61._24_8_ = uStack_948;
  auVar36 = vpmulld_avx2(auVar32,auVar61);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar97._16_8_ = uStack_890;
  auVar97._0_16_ = auVar130;
  auVar97._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar97);
  auVar32 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar60._16_8_ = uStack_950;
  auVar60._0_16_ = auVar23;
  auVar60._24_8_ = uStack_948;
  auVar26 = vpmulld_avx2(auVar33,auVar60);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar96._16_8_ = uStack_890;
  auVar96._0_16_ = auVar130;
  auVar96._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar96);
  auVar33 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar59._16_8_ = uStack_950;
  auVar59._0_16_ = auVar23;
  auVar59._24_8_ = uStack_948;
  auVar26 = vpmulld_avx2(auVar35,auVar59);
  auVar58._16_8_ = uStack_950;
  auVar58._0_16_ = auVar23;
  auVar58._24_8_ = uStack_948;
  auVar27 = vpmulld_avx2(auVar34,auVar58);
  auVar57._16_8_ = uStack_910;
  auVar57._0_16_ = auVar24;
  auVar57._24_8_ = uStack_908;
  auVar36 = vpmulld_avx2(auVar34,auVar57);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar95._16_8_ = uStack_890;
  auVar95._0_16_ = auVar130;
  auVar95._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar95);
  auVar34 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar56._16_8_ = uStack_910;
  auVar56._0_16_ = auVar24;
  auVar56._24_8_ = uStack_908;
  auVar26 = vpmulld_avx2(auVar35,auVar56);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar94._16_8_ = uStack_890;
  auVar94._0_16_ = auVar130;
  auVar94._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar94);
  auVar35 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar55._16_8_ = uStack_990;
  auVar55._0_16_ = auVar22;
  auVar55._24_8_ = uStack_988;
  auVar26 = vpmulld_avx2(auVar41,auVar55);
  auVar54._16_8_ = uStack_990;
  auVar54._0_16_ = auVar22;
  auVar54._24_8_ = uStack_988;
  auVar27 = vpmulld_avx2(auVar40,auVar54);
  auVar53._16_8_ = uStack_950;
  auVar53._0_16_ = auVar23;
  auVar53._24_8_ = uStack_948;
  auVar36 = vpmulld_avx2(auVar40,auVar53);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar93._16_8_ = uStack_890;
  auVar93._0_16_ = auVar130;
  auVar93._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar93);
  auVar40 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar52._16_8_ = uStack_950;
  auVar52._0_16_ = auVar23;
  auVar52._24_8_ = uStack_948;
  auVar26 = vpmulld_avx2(auVar41,auVar52);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar92._16_8_ = uStack_890;
  auVar92._0_16_ = auVar130;
  auVar92._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar92);
  auVar41 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar51._16_8_ = uStack_950;
  auVar51._0_16_ = auVar23;
  auVar51._24_8_ = uStack_948;
  auVar26 = vpmulld_avx2(auVar43,auVar51);
  auVar50._16_8_ = uStack_950;
  auVar50._0_16_ = auVar23;
  auVar50._24_8_ = uStack_948;
  auVar27 = vpmulld_avx2(auVar42,auVar50);
  auVar49._16_8_ = uStack_910;
  auVar49._0_16_ = auVar24;
  auVar49._24_8_ = uStack_908;
  auVar36 = vpmulld_avx2(auVar42,auVar49);
  auVar26 = vpaddd_avx2(auVar36,auVar26);
  auVar91._16_8_ = uStack_890;
  auVar91._0_16_ = auVar130;
  auVar91._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar91);
  auVar42 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar48._16_8_ = uStack_910;
  auVar48._0_16_ = auVar24;
  auVar48._24_8_ = uStack_908;
  auVar26 = vpmulld_avx2(auVar43,auVar48);
  auVar26 = vpsubd_avx2(auVar27,auVar26);
  auVar90._16_8_ = uStack_890;
  auVar90._0_16_ = auVar130;
  auVar90._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar90);
  auVar43 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  in0_15[0]._4_4_ = uVar142;
  in0_15[0]._0_4_ = uVar141;
  in0_15[1]._0_4_ = uVar143;
  in0_15[1]._4_4_ = uVar144;
  in0_15[2]._0_4_ = uVar145;
  in0_15[2]._4_4_ = uVar146;
  in0_15[3]._0_4_ = uVar147;
  in0_15[3]._4_4_ = uVar148;
  in1_15[0]._4_4_ = uVar135;
  in1_15[0]._0_4_ = uVar134;
  in1_15[1]._0_4_ = uVar136;
  in1_15[1]._4_4_ = uVar137;
  in1_15[2]._0_4_ = uVar138;
  in1_15[2]._4_4_ = uVar139;
  in1_15[3]._0_4_ = uVar140;
  in1_15[3]._4_4_ = shift;
  addsub_avx2(in0_15,in1_15,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_16[0]._4_4_ = uVar142;
  in0_16[0]._0_4_ = uVar141;
  in0_16[1]._0_4_ = uVar143;
  in0_16[1]._4_4_ = uVar144;
  in0_16[2]._0_4_ = uVar145;
  in0_16[2]._4_4_ = uVar146;
  in0_16[3]._0_4_ = uVar147;
  in0_16[3]._4_4_ = uVar148;
  in1_16[0]._4_4_ = uVar135;
  in1_16[0]._0_4_ = uVar134;
  in1_16[1]._0_4_ = uVar136;
  in1_16[1]._4_4_ = uVar137;
  in1_16[2]._0_4_ = uVar138;
  in1_16[2]._4_4_ = uVar139;
  in1_16[3]._0_4_ = uVar140;
  in1_16[3]._4_4_ = shift;
  addsub_avx2(in0_16,in1_16,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_17[0]._4_4_ = uVar142;
  in0_17[0]._0_4_ = uVar141;
  in0_17[1]._0_4_ = uVar143;
  in0_17[1]._4_4_ = uVar144;
  in0_17[2]._0_4_ = uVar145;
  in0_17[2]._4_4_ = uVar146;
  in0_17[3]._0_4_ = uVar147;
  in0_17[3]._4_4_ = uVar148;
  in1_17[0]._4_4_ = uVar135;
  in1_17[0]._0_4_ = uVar134;
  in1_17[1]._0_4_ = uVar136;
  in1_17[1]._4_4_ = uVar137;
  in1_17[2]._0_4_ = uVar138;
  in1_17[2]._4_4_ = uVar139;
  in1_17[3]._0_4_ = uVar140;
  in1_17[3]._4_4_ = shift;
  addsub_avx2(in0_17,in1_17,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_18[0]._4_4_ = uVar142;
  in0_18[0]._0_4_ = uVar141;
  in0_18[1]._0_4_ = uVar143;
  in0_18[1]._4_4_ = uVar144;
  in0_18[2]._0_4_ = uVar145;
  in0_18[2]._4_4_ = uVar146;
  in0_18[3]._0_4_ = uVar147;
  in0_18[3]._4_4_ = uVar148;
  in1_18[0]._4_4_ = uVar135;
  in1_18[0]._0_4_ = uVar134;
  in1_18[1]._0_4_ = uVar136;
  in1_18[1]._4_4_ = uVar137;
  in1_18[2]._0_4_ = uVar138;
  in1_18[2]._4_4_ = uVar139;
  in1_18[3]._0_4_ = uVar140;
  in1_18[3]._4_4_ = shift;
  addsub_avx2(in0_18,in1_18,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_19[0]._4_4_ = uVar142;
  in0_19[0]._0_4_ = uVar141;
  in0_19[1]._0_4_ = uVar143;
  in0_19[1]._4_4_ = uVar144;
  in0_19[2]._0_4_ = uVar145;
  in0_19[2]._4_4_ = uVar146;
  in0_19[3]._0_4_ = uVar147;
  in0_19[3]._4_4_ = uVar148;
  in1_19[0]._4_4_ = uVar135;
  in1_19[0]._0_4_ = uVar134;
  in1_19[1]._0_4_ = uVar136;
  in1_19[1]._4_4_ = uVar137;
  in1_19[2]._0_4_ = uVar138;
  in1_19[2]._4_4_ = uVar139;
  in1_19[3]._0_4_ = uVar140;
  in1_19[3]._4_4_ = shift;
  addsub_avx2(in0_19,in1_19,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_20[0]._4_4_ = uVar142;
  in0_20[0]._0_4_ = uVar141;
  in0_20[1]._0_4_ = uVar143;
  in0_20[1]._4_4_ = uVar144;
  in0_20[2]._0_4_ = uVar145;
  in0_20[2]._4_4_ = uVar146;
  in0_20[3]._0_4_ = uVar147;
  in0_20[3]._4_4_ = uVar148;
  in1_20[0]._4_4_ = uVar135;
  in1_20[0]._0_4_ = uVar134;
  in1_20[1]._0_4_ = uVar136;
  in1_20[1]._4_4_ = uVar137;
  in1_20[2]._0_4_ = uVar138;
  in1_20[2]._4_4_ = uVar139;
  in1_20[3]._0_4_ = uVar140;
  in1_20[3]._4_4_ = shift;
  addsub_avx2(in0_20,in1_20,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_21[0]._4_4_ = uVar142;
  in0_21[0]._0_4_ = uVar141;
  in0_21[1]._0_4_ = uVar143;
  in0_21[1]._4_4_ = uVar144;
  in0_21[2]._0_4_ = uVar145;
  in0_21[2]._4_4_ = uVar146;
  in0_21[3]._0_4_ = uVar147;
  in0_21[3]._4_4_ = uVar148;
  in1_21[0]._4_4_ = uVar135;
  in1_21[0]._0_4_ = uVar134;
  in1_21[1]._0_4_ = uVar136;
  in1_21[1]._4_4_ = uVar137;
  in1_21[2]._0_4_ = uVar138;
  in1_21[2]._4_4_ = uVar139;
  in1_21[3]._0_4_ = uVar140;
  in1_21[3]._4_4_ = shift;
  addsub_avx2(in0_21,in1_21,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  in0_22[0]._4_4_ = uVar142;
  in0_22[0]._0_4_ = uVar141;
  in0_22[1]._0_4_ = uVar143;
  in0_22[1]._4_4_ = uVar144;
  in0_22[2]._0_4_ = uVar145;
  in0_22[2]._4_4_ = uVar146;
  in0_22[3]._0_4_ = uVar147;
  in0_22[3]._4_4_ = uVar148;
  in1_22[0]._4_4_ = uVar135;
  in1_22[0]._0_4_ = uVar134;
  in1_22[1]._0_4_ = uVar136;
  in1_22[1]._4_4_ = uVar137;
  in1_22[2]._0_4_ = uVar138;
  in1_22[2]._4_4_ = uVar139;
  in1_22[3]._0_4_ = uVar140;
  in1_22[3]._4_4_ = shift;
  addsub_avx2(in0_22,in1_22,(__m256i *)CONCAT44(uVar129,iVar133),
              (__m256i *)CONCAT44(uVar126,uVar128),in_stack_ffffffffffffc420,local_3c00);
  auVar47._16_8_ = uStack_8d0;
  auVar47._0_16_ = auVar25;
  auVar47._24_8_ = uStack_8c8;
  auVar27 = vpmulld_avx2(auVar30,auVar47);
  auVar30._16_8_ = uStack_8d0;
  auVar30._0_16_ = auVar25;
  auVar30._24_8_ = uStack_8c8;
  auVar36 = vpmulld_avx2(auVar31,auVar30);
  auVar26 = vpaddd_avx2(auVar27,auVar36);
  auVar89._16_8_ = uStack_890;
  auVar89._0_16_ = auVar130;
  auVar89._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar89);
  auVar30 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar36);
  auVar88._16_8_ = uStack_890;
  auVar88._0_16_ = auVar130;
  auVar88._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar88);
  auVar31 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar46._16_8_ = uStack_8d0;
  auVar46._0_16_ = auVar25;
  auVar46._24_8_ = uStack_8c8;
  auVar27 = vpmulld_avx2(auVar34,auVar46);
  auVar34._16_8_ = uStack_8d0;
  auVar34._0_16_ = auVar25;
  auVar34._24_8_ = uStack_8c8;
  auVar36 = vpmulld_avx2(auVar35,auVar34);
  auVar26 = vpaddd_avx2(auVar27,auVar36);
  auVar87._16_8_ = uStack_890;
  auVar87._0_16_ = auVar130;
  auVar87._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar87);
  auVar34 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar36);
  auVar86._16_8_ = uStack_890;
  auVar86._0_16_ = auVar130;
  auVar86._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar86);
  auVar35 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar45._16_8_ = uStack_8d0;
  auVar45._0_16_ = auVar25;
  auVar45._24_8_ = uStack_8c8;
  auVar27 = vpmulld_avx2(auVar38,auVar45);
  auVar36._16_8_ = uStack_8d0;
  auVar36._0_16_ = auVar25;
  auVar36._24_8_ = uStack_8c8;
  auVar36 = vpmulld_avx2(auVar39,auVar36);
  auVar26 = vpaddd_avx2(auVar27,auVar36);
  auVar85._16_8_ = uStack_890;
  auVar85._0_16_ = auVar130;
  auVar85._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar85);
  auVar38 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar36);
  auVar84._16_8_ = uStack_890;
  auVar84._0_16_ = auVar130;
  auVar84._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar84);
  auVar39 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar27._16_8_ = uStack_8d0;
  auVar27._0_16_ = auVar25;
  auVar27._24_8_ = uStack_8c8;
  auVar27 = vpmulld_avx2(auVar42,auVar27);
  auVar26._16_8_ = uStack_8d0;
  auVar26._0_16_ = auVar25;
  auVar26._24_8_ = uStack_8c8;
  auVar36 = vpmulld_avx2(auVar43,auVar26);
  auVar26 = vpaddd_avx2(auVar27,auVar36);
  auVar83._16_8_ = uStack_890;
  auVar83._0_16_ = auVar130;
  auVar83._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar83);
  auVar42 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  auVar26 = vpsubd_avx2(auVar27,auVar36);
  auVar82._16_8_ = uStack_890;
  auVar82._0_16_ = auVar130;
  auVar82._24_8_ = uStack_888;
  auVar26 = vpaddd_avx2(auVar26,auVar82);
  auVar26 = vpsrad_avx2(auVar26,ZEXT416(in_EDX));
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_3c04 = '\x10';
    }
    else {
      local_3c04 = (char)in_R8D + '\x06';
    }
    uVar129 = -(1 << (local_3c04 - 1U & 0x1f));
    auVar1 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
    auVar1 = vpinsrd_avx(auVar1,uVar129,2);
    vpinsrd_avx(auVar1,uVar129,3);
    auVar1 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
    auVar1 = vpinsrd_avx(auVar1,uVar129,2);
    vpinsrd_avx(auVar1,uVar129,3);
    uVar129 = (1 << (local_3c04 - 1U & 0x1f)) - 1;
    auVar1 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
    auVar1 = vpinsrd_avx(auVar1,uVar129,2);
    auVar1 = vpinsrd_avx(auVar1,uVar129,3);
    auVar131 = vpinsrd_avx(ZEXT416(uVar129),uVar129,1);
    auVar131 = vpinsrd_avx(auVar131,uVar129,2);
    auVar131 = vpinsrd_avx(auVar131,uVar129,3);
    auVar131 = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar131;
    local_7a0 = auVar131._0_8_;
    uStack_798 = auVar131._8_8_;
    lStack_790 = SUB168(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1,0);
    in0_23[0]._4_4_ = uVar125;
    in0_23[0]._0_4_ = uVar154;
    in0_23[1] = local_7a0;
    in0_23[2] = uStack_798;
    in0_23[3] = lStack_790;
    in1_23[0]._4_4_ = uVar150;
    in1_23[0]._0_4_ = uVar149;
    in1_23[1]._0_4_ = uVar151;
    in1_23[1]._4_4_ = uVar122;
    in1_23[2]._0_4_ = uVar123;
    in1_23[2]._4_4_ = uVar152;
    in1_23[3]._0_4_ = uVar153;
    in1_23[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_23,in1_23,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_24[0]._4_4_ = uVar125;
    in0_24[0]._0_4_ = uVar154;
    in0_24[1] = auVar131._0_8_;
    in0_24[2] = auVar131._8_8_;
    in0_24[3] = lStack_790;
    in1_24[0]._4_4_ = uVar150;
    in1_24[0]._0_4_ = uVar149;
    in1_24[1]._0_4_ = uVar151;
    in1_24[1]._4_4_ = uVar122;
    in1_24[2]._0_4_ = uVar123;
    in1_24[2]._4_4_ = uVar152;
    in1_24[3]._0_4_ = uVar153;
    in1_24[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_24,in1_24,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_25[0]._4_4_ = uVar125;
    in0_25[0]._0_4_ = uVar154;
    in0_25[1] = auVar131._0_8_;
    in0_25[2] = auVar131._8_8_;
    in0_25[3] = lStack_790;
    in1_25[0]._4_4_ = uVar150;
    in1_25[0]._0_4_ = uVar149;
    in1_25[1]._0_4_ = uVar151;
    in1_25[1]._4_4_ = uVar122;
    in1_25[2]._0_4_ = uVar123;
    in1_25[2]._4_4_ = uVar152;
    in1_25[3]._0_4_ = uVar153;
    in1_25[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_25,in1_25,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_26[0]._4_4_ = uVar125;
    in0_26[0]._0_4_ = uVar154;
    in0_26[1] = auVar131._0_8_;
    in0_26[2] = auVar131._8_8_;
    in0_26[3] = lStack_790;
    in1_26[0]._4_4_ = uVar150;
    in1_26[0]._0_4_ = uVar149;
    in1_26[1]._0_4_ = uVar151;
    in1_26[1]._4_4_ = uVar122;
    in1_26[2]._0_4_ = uVar123;
    in1_26[2]._4_4_ = uVar152;
    in1_26[3]._0_4_ = uVar153;
    in1_26[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_26,in1_26,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_27[0]._4_4_ = uVar125;
    in0_27[0]._0_4_ = uVar154;
    in0_27[1] = auVar131._0_8_;
    in0_27[2] = auVar131._8_8_;
    in0_27[3] = lStack_790;
    in1_27[0]._4_4_ = uVar150;
    in1_27[0]._0_4_ = uVar149;
    in1_27[1]._0_4_ = uVar151;
    in1_27[1]._4_4_ = uVar122;
    in1_27[2]._0_4_ = uVar123;
    in1_27[2]._4_4_ = uVar152;
    in1_27[3]._0_4_ = uVar153;
    in1_27[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_27,in1_27,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_28[0]._4_4_ = uVar125;
    in0_28[0]._0_4_ = uVar154;
    in0_28[1] = auVar131._0_8_;
    in0_28[2] = auVar131._8_8_;
    in0_28[3] = lStack_790;
    in1_28[0]._4_4_ = uVar150;
    in1_28[0]._0_4_ = uVar149;
    in1_28[1]._0_4_ = uVar151;
    in1_28[1]._4_4_ = uVar122;
    in1_28[2]._0_4_ = uVar123;
    in1_28[2]._4_4_ = uVar152;
    in1_28[3]._0_4_ = uVar153;
    in1_28[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_28,in1_28,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_29[0]._4_4_ = uVar125;
    in0_29[0]._0_4_ = uVar154;
    in0_29[1] = auVar131._0_8_;
    in0_29[2] = auVar131._8_8_;
    in0_29[3] = lStack_790;
    in1_29[0]._4_4_ = uVar150;
    in1_29[0]._0_4_ = uVar149;
    in1_29[1]._0_4_ = uVar151;
    in1_29[1]._4_4_ = uVar122;
    in1_29[2]._0_4_ = uVar123;
    in1_29[2]._4_4_ = uVar152;
    in1_29[3]._0_4_ = uVar153;
    in1_29[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_29,in1_29,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
    in0_30[0]._4_4_ = uVar125;
    in0_30[0]._0_4_ = uVar154;
    in0_30[1] = auVar131._0_8_;
    in0_30[2] = auVar131._8_8_;
    in0_30[3] = lStack_790;
    in1_30[0]._4_4_ = uVar150;
    in1_30[0]._0_4_ = uVar149;
    in1_30[1]._0_4_ = uVar151;
    in1_30[1]._4_4_ = uVar122;
    in1_30[2]._0_4_ = uVar123;
    in1_30[2]._4_4_ = uVar152;
    in1_30[3]._0_4_ = uVar153;
    in1_30[3]._4_4_ = uVar124;
    neg_shift_avx2(in0_30,in1_30,(__m256i *)CONCAT44(uVar148,uVar147),
                   (__m256i *)CONCAT44(uVar146,uVar145),(__m256i *)CONCAT44(uVar144,uVar143),
                   (__m256i *)CONCAT44(uVar142,uVar141),shift);
  }
  else {
    local_3aa0 = auVar28._0_8_;
    uStack_3a98 = auVar28._8_8_;
    uStack_3a90 = auVar28._16_8_;
    uStack_3a88 = auVar28._24_8_;
    *in_RSI = local_3aa0;
    in_RSI[1] = uStack_3a98;
    in_RSI[2] = uStack_3a90;
    in_RSI[3] = uStack_3a88;
    uStack_78 = SUB328(ZEXT832(0),4);
    auVar27 = vpsubd_avx2(ZEXT832(uStack_78) << 0x40,auVar44);
    *(undefined1 (*) [32])(in_RSI + 4) = auVar27;
    local_3920 = auVar40._0_8_;
    uStack_3918 = auVar40._8_8_;
    uStack_3910 = auVar40._16_8_;
    uStack_3908 = auVar40._24_8_;
    in_RSI[8] = local_3920;
    in_RSI[9] = uStack_3918;
    in_RSI[10] = uStack_3910;
    in_RSI[0xb] = uStack_3908;
    uStack_98 = SUB328(ZEXT832(0),4);
    auVar27 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar32);
    *(undefined1 (*) [32])(in_RSI + 0xc) = auVar27;
    local_39e0 = auVar34._0_8_;
    uStack_39d8 = auVar34._8_8_;
    uStack_39d0 = auVar34._16_8_;
    uStack_39c8 = auVar34._24_8_;
    in_RSI[0x10] = local_39e0;
    in_RSI[0x11] = uStack_39d8;
    in_RSI[0x12] = uStack_39d0;
    in_RSI[0x13] = uStack_39c8;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar42);
    *(undefined1 (*) [32])(in_RSI + 0x14) = auVar27;
    local_3960 = auVar38._0_8_;
    uStack_3958 = auVar38._8_8_;
    uStack_3950 = auVar38._16_8_;
    uStack_3948 = auVar38._24_8_;
    in_RSI[0x18] = local_3960;
    in_RSI[0x19] = uStack_3958;
    in_RSI[0x1a] = uStack_3950;
    in_RSI[0x1b] = uStack_3948;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar30);
    *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar27;
    local_3a40 = auVar31._0_8_;
    uStack_3a38 = auVar31._8_8_;
    uStack_3a30 = auVar31._16_8_;
    uStack_3a28 = auVar31._24_8_;
    in_RSI[0x20] = local_3a40;
    in_RSI[0x21] = uStack_3a38;
    in_RSI[0x22] = uStack_3a30;
    in_RSI[0x23] = uStack_3a28;
    auVar27 = vpsubd_avx2(ZEXT832(uStack_98) << 0x40,auVar39);
    *(undefined1 (*) [32])(in_RSI + 0x24) = auVar27;
    local_38c0 = auVar26._0_8_;
    uStack_38b8 = auVar26._8_8_;
    uStack_38b0 = auVar26._16_8_;
    uStack_38a8 = auVar26._24_8_;
    in_RSI[0x28] = local_38c0;
    in_RSI[0x29] = uStack_38b8;
    in_RSI[0x2a] = uStack_38b0;
    in_RSI[0x2b] = uStack_38a8;
    uStack_118 = SUB328(ZEXT832(0),4);
    auVar26 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar35);
    *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar26;
    local_3a00 = auVar33._0_8_;
    uStack_39f8 = auVar33._8_8_;
    uStack_39f0 = auVar33._16_8_;
    uStack_39e8 = auVar33._24_8_;
    in_RSI[0x30] = local_3a00;
    in_RSI[0x31] = uStack_39f8;
    in_RSI[0x32] = uStack_39f0;
    in_RSI[0x33] = uStack_39e8;
    auVar26 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar41);
    *(undefined1 (*) [32])(in_RSI + 0x34) = auVar26;
    local_3980 = auVar37._0_8_;
    uStack_3978 = auVar37._8_8_;
    uStack_3970 = auVar37._16_8_;
    uStack_3968 = auVar37._24_8_;
    in_RSI[0x38] = local_3980;
    in_RSI[0x39] = uStack_3978;
    in_RSI[0x3a] = uStack_3970;
    in_RSI[0x3b] = uStack_3968;
    auVar26 = vpsubd_avx2(ZEXT832(uStack_118) << 0x40,auVar29);
    *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar26;
  }
  return;
}

Assistant:

static void iadst16_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x1[16];
  x1[1] = input[0];
  x1[3] = input[2];
  x1[5] = input[4];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[10] = input[5];
  x1[12] = input[3];
  x1[14] = input[1];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], -cospi[2], x1[1], x1[0], x1[1]);
  btf_16_w16_0_avx2(cospi[54], -cospi[10], x1[3], x1[2], x1[3]);
  btf_16_w16_0_avx2(cospi[46], -cospi[18], x1[5], x1[4], x1[5]);
  btf_16_w16_0_avx2(cospi[38], -cospi[26], x1[7], x1[6], x1[7]);
  btf_16_w16_0_avx2(cospi[34], cospi[30], x1[8], x1[8], x1[9]);
  btf_16_w16_0_avx2(cospi[42], cospi[22], x1[10], x1[10], x1[11]);
  btf_16_w16_0_avx2(cospi[50], cospi[14], x1[12], x1[12], x1[13]);
  btf_16_w16_0_avx2(cospi[58], cospi[06], x1[14], x1[14], x1[15]);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}